

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
FeatureUnsupportedFailure::FeatureUnsupportedFailure
          (FeatureUnsupportedFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *featureName,SimpleString *text)

{
  SimpleString *this_00;
  TestFailure *in_RCX;
  undefined8 *in_RDI;
  TestFailure *in_R8;
  SimpleString *in_R9;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  char local_60 [40];
  size_t in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure(in_RCX,(UtestShell *)in_R8,(char *)in_R9,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__FeatureUnsupportedFailure_001c4db0;
  TestFailure::createUserText(in_R8,in_R9);
  SimpleString::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)0x17c69f);
  this_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x17c6a9);
  StringFromFormat(local_60,
                   "The feature \"%s\" is not supported in this environment or with the feature set selected when building the library."
                   ,this_00);
  SimpleString::operator+=(this_00,in_stack_ffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)0x17c6e9);
  return;
}

Assistant:

FeatureUnsupportedFailure::FeatureUnsupportedFailure(UtestShell* test, const char* fileName, size_t lineNumber,
                                                     const SimpleString& featureName, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("The feature \"%s\" is not supported in this environment or with the feature set selected when building the library.", featureName.asCharString());
}